

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleWriteCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool append)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Ios_Openmode _Var6;
  byte bVar7;
  mode_t mode;
  string error_1;
  string fileName;
  string message;
  string dir;
  ofstream file;
  mode_t local_2d4;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_250;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  bVar3 = cmsys::SystemTools::FileIsFullPath(pbVar1 + 1);
  if (!bVar3) {
    cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::_M_assign((string *)&local_2b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   "/",pbVar1 + 1);
    std::__cxx11::string::_M_append((char *)&local_2b0,local_230._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
  }
  bVar3 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,&local_2b0);
  if (bVar3) {
    cmsys::SystemTools::GetFilenamePath(&local_270,&local_2b0);
    cmsys::SystemTools::MakeDirectory(&local_270,(mode_t *)0x0);
    local_2d4 = 0;
    bVar3 = cmsys::SystemTools::GetPermissions(&local_2b0,&local_2d4);
    if (bVar3) {
      if ((char)(byte)local_2d4 < '\0') {
        bVar7 = (byte)local_2d4 >> 7;
      }
      else {
        bVar7 = 0;
        cmsys::SystemTools::SetPermissions(&local_2b0,local_2d4 | 0x90,false);
      }
    }
    else {
      bVar7 = 0;
    }
    _Var6 = _S_out;
    if (append) {
      _Var6 = _S_app;
    }
    std::ofstream::ofstream(local_230,local_2b0._M_dataplus._M_p,_Var6);
    if ((abStack_210[*(long *)(local_230._0_8_ - 0x18)] & 5) == 0) {
      local_250.Begin._M_current = pbVar1 + 2;
      local_250.End._M_current =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      paVar5 = &local_2d0.field_2;
      local_2d0._M_string_length = 0;
      local_2d0.field_2._M_local_buf[0] = '\0';
      local_2d0._M_dataplus._M_p = (pointer)paVar5;
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                (&local_290,&local_250,paVar5->_M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar5) {
        operator_delete(local_2d0._M_dataplus._M_p,
                        CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                                 local_2d0.field_2._M_local_buf[0]) + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,local_290._M_dataplus._M_p,local_290._M_string_length);
      bVar3 = (abStack_210[*(long *)(local_230._0_8_ - 0x18)] & 5) == 0;
      if (bVar3) {
        std::ofstream::close();
        if (bVar7 == 0 && local_2d4 != 0) {
          cmsys::SystemTools::SetPermissions(&local_2b0,local_2d4,false);
        }
      }
      else {
        local_2d0._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"write failed (","");
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_250.Begin._M_current);
        if (local_250.Begin._M_current != (pointer)local_240) {
          operator_delete(local_250.Begin._M_current,(ulong)(local_240._0_8_ + 1));
        }
        std::__cxx11::string::append((char *)&local_2d0);
        std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_2b0._M_dataplus._M_p);
        cmCommand::SetError(&this->super_cmCommand,&local_2d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != paVar5) {
          operator_delete(local_2d0._M_dataplus._M_p,
                          CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                                   local_2d0.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,"failed to open for writing (","");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2d0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,
                        CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                                 local_2d0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::append((char *)&local_290);
      std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p);
      cmCommand::SetError(&this->super_cmCommand,&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::operator+(&local_270,"attempted to write a file: ",&local_2b0);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_270);
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar5) {
      local_220._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_220._8_8_ = plVar4[3];
      local_230._0_8_ = &local_220;
    }
    else {
      local_220._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_230._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar4;
    }
    local_230._8_8_ = plVar4[1];
    *plVar4 = (long)paVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_230);
    cmSystemTools::s_FatalErrorOccured = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmFileCommand::HandleWriteCommand(std::vector<std::string> const& args,
                                       bool append)
{
  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if (!cmsys::SystemTools::FileIsFullPath(*i)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + *i;
  }

  i++;

  if (!this->Makefile->CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName, mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName, newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       append ? std::ios::app : std::ios::out);
  if (!file) {
    std::string error = "failed to open for writing (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }
  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());
  file << message;
  if (!file) {
    std::string error = "write failed (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName, mode);
  }
  return true;
}